

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_decomp_img(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  FITSfile *pFVar1;
  long lVar2;
  double *nulval;
  int iVar3;
  void *array;
  ulong uVar4;
  ulong uVar5;
  char *err_message;
  long lVar6;
  long nelem;
  int local_e4;
  float fnulval;
  int anynul;
  double *local_d8;
  double dnulval;
  long inc [6];
  LONGLONG lpixel [6];
  LONGLONG fpixel [6];
  
  if (0 < *status) {
    return *status;
  }
  iVar3 = fits_is_compressed_image(infptr,status);
  if (iVar3 == 0) {
    ffpmsg("CHDU is not a compressed image (fits_decompress_img)");
    *status = 0x19e;
    return 0x19e;
  }
  pFVar1 = infptr->Fptr;
  iVar3 = ffcrim(outfptr,pFVar1->zbitpix,pFVar1->zndim,pFVar1->znaxis,status);
  if (iVar3 < 1) {
    iVar3 = imcomp_copy_imheader(infptr,outfptr,status);
    if (iVar3 < 1) {
      ffrdef(outfptr,status);
      ffpscl(outfptr,1.0,0.0,status);
      ffpscl(infptr,1.0,0.0,status);
      pFVar1 = infptr->Fptr;
      iVar3 = pFVar1->zbitpix;
      nelem = 1;
      if (iVar3 == -0x40) {
        lVar6 = 8;
        local_d8 = &dnulval;
        dnulval = -9.1191291391491e-36;
        local_e4 = 1;
        iVar3 = 0x52;
      }
      else {
        local_d8 = (double *)&fnulval;
        if (iVar3 == -0x20) {
          fnulval = -9.11912e-36;
          local_e4 = 1;
          lVar6 = 4;
          iVar3 = 0x2a;
        }
        else if (iVar3 == 8) {
          local_e4 = 0;
          iVar3 = 0xb;
          lVar6 = nelem;
        }
        else if (iVar3 == 0x20) {
          local_e4 = 0;
          lVar6 = 4;
          iVar3 = 0x1f;
        }
        else if (iVar3 == 0x10) {
          local_e4 = 0;
          lVar6 = 2;
          iVar3 = 0x15;
        }
        else {
          iVar3 = 0;
          local_e4 = 0;
          lVar6 = 0;
        }
      }
      uVar5 = 0;
      uVar4 = (ulong)(uint)pFVar1->zndim;
      if (pFVar1->zndim < 1) {
        uVar4 = uVar5;
      }
      for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        lVar2 = pFVar1->znaxis[uVar5];
        nelem = nelem * lVar2;
        fpixel[uVar5] = 1;
        lpixel[uVar5] = lVar2;
        inc[uVar5] = 1;
      }
      array = calloc((lVar6 * nelem - 1U >> 3) + 1,8);
      nulval = local_d8;
      if (array == (void *)0x0) {
        ffpmsg("Couldn\'t allocate memory for the uncompressed image");
        *status = 0x71;
        return 0x71;
      }
      fits_read_compressed_img
                (infptr,iVar3,fpixel,lpixel,inc,local_e4,local_d8,array,(char *)0x0,&anynul,status);
      if (anynul == 0) {
        ffppr(outfptr,iVar3,1,nelem,array,status);
      }
      else {
        ffppn(outfptr,iVar3,1,nelem,array,nulval,status);
      }
      free(array);
      goto LAB_001c4697;
    }
    err_message = "error copying header of compressed image";
  }
  else {
    err_message = "error creating output decompressed image HDU";
  }
  ffpmsg(err_message);
LAB_001c4697:
  return *status;
}

Assistant:

int fits_decompress_img (fitsfile *infptr, /* image (bintable) to uncompress */
              fitsfile *outfptr,   /* empty HDU for output uncompressed image */
              int *status)         /* IO - error status               */

/* 
  THIS IS AN OBSOLETE ROUTINE.  USE fits_img_decompress instead!!!
  
  This routine decompresses the whole image and writes it to the output file.
*/

{
    double *data;
    int ii, datatype = 0, byte_per_pix = 0;
    int nullcheck, anynul;
    LONGLONG fpixel[MAX_COMPRESS_DIM], lpixel[MAX_COMPRESS_DIM];
    long inc[MAX_COMPRESS_DIM];
    long imgsize, memsize;
    float *nulladdr, fnulval;
    double dnulval;

    if (*status > 0)
        return(*status);

    if (!fits_is_compressed_image(infptr, status) )
    {
        ffpmsg("CHDU is not a compressed image (fits_decompress_img)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    /* create an empty output image with the correct dimensions */
    if (ffcrim(outfptr, (infptr->Fptr)->zbitpix, (infptr->Fptr)->zndim, 
       (infptr->Fptr)->znaxis, status) > 0)
    {
        ffpmsg("error creating output decompressed image HDU");
    	return (*status);
    }
    /* Copy the table header to the image header. */
    if (imcomp_copy_imheader(infptr, outfptr, status) > 0)
    {
        ffpmsg("error copying header of compressed image");
    	return (*status);
    }

    /* force a rescan of the output header keywords, then reset the scaling */
    /* in case the BSCALE and BZERO keywords are present, so that the       */
    /* decompressed values won't be scaled when written to the output image */
    ffrdef(outfptr, status);
    ffpscl(outfptr, 1.0, 0.0, status);
    ffpscl(infptr, 1.0, 0.0, status);

    /* initialize; no null checking is needed for integer images */
    nullcheck = 0;
    nulladdr =  &fnulval;

    /* determine datatype for image */
    if ((infptr->Fptr)->zbitpix == BYTE_IMG)
    {
        datatype = TBYTE;
        byte_per_pix = 1;
    }
    else if ((infptr->Fptr)->zbitpix == SHORT_IMG)
    {
        datatype = TSHORT;
        byte_per_pix = sizeof(short);
    }
    else if ((infptr->Fptr)->zbitpix == LONG_IMG)
    {
        datatype = TINT;
        byte_per_pix = sizeof(int);
    }
    else if ((infptr->Fptr)->zbitpix == FLOAT_IMG)
    {
        /* In the case of float images we must check for NaNs  */
        nullcheck = 1;
        fnulval = FLOATNULLVALUE;
        nulladdr =  &fnulval;
        datatype = TFLOAT;
        byte_per_pix = sizeof(float);
    }
    else if ((infptr->Fptr)->zbitpix == DOUBLE_IMG)
    {
        /* In the case of double images we must check for NaNs  */
        nullcheck = 1;
        dnulval = DOUBLENULLVALUE;
        nulladdr = (float *) &dnulval;
        datatype = TDOUBLE;
        byte_per_pix = sizeof(double);
    }

    /* calculate size of the image (in pixels) */
    imgsize = 1;
    for (ii = 0; ii < (infptr->Fptr)->zndim; ii++)
    {
        imgsize *= (infptr->Fptr)->znaxis[ii];
        fpixel[ii] = 1;              /* Set first and last pixel to */
        lpixel[ii] = (infptr->Fptr)->znaxis[ii]; /* include the entire image. */
        inc[ii] = 1;
    }
    /* Calc equivalent number of double pixels same size as whole the image. */
    /* We use double datatype to force the memory to be aligned properly */
    memsize = ((imgsize * byte_per_pix) - 1) / sizeof(double) + 1;

    /* allocate memory for the image */
    data = (double*) calloc (memsize, sizeof(double));
    if (!data)
    { 
        ffpmsg("Couldn't allocate memory for the uncompressed image");
        return(*status = MEMORY_ALLOCATION);
    }

    /* uncompress the entire image into memory */
    /* This routine should be enhanced sometime to only need enough */
    /* memory to uncompress one tile at a time.  */
    fits_read_compressed_img(infptr, datatype, fpixel, lpixel, inc,  
            nullcheck, nulladdr, data, NULL, &anynul, status);

    /* write the image to the output file */
    if (anynul)
        fits_write_imgnull(outfptr, datatype, 1, imgsize, data, nulladdr, 
                          status);
    else
        fits_write_img(outfptr, datatype, 1, imgsize, data, status);

    free(data);
    return (*status);
}